

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall CAtEmLogging::tAtEmLog(CAtEmLogging *this,void *pvParm)

{
  int iVar1;
  MSG_BUFFER_DESC *pMVar2;
  
  this->m_bLogTaskRunning = 1;
  iVar1 = this->m_bShutdownLogTask;
  while (iVar1 == 0) {
    for (pMVar2 = this->m_pFirstMsgBufferDesc; pMVar2 != (MSG_BUFFER_DESC *)0x0;
        pMVar2 = pMVar2->pNextMsgBuf) {
      ProcessMsgs(this,pMVar2);
    }
    LinuxSleep(1);
    iVar1 = this->m_bShutdownLogTask;
  }
  for (pMVar2 = this->m_pFirstMsgBufferDesc; pMVar2 != (MSG_BUFFER_DESC *)0x0;
      pMVar2 = pMVar2->pNextMsgBuf) {
    ProcessMsgs(this,pMVar2);
  }
  this->m_bLogTaskRunning = 0;
  return;
}

Assistant:

EC_T_VOID CAtEmLogging::tAtEmLog(EC_T_VOID* pvParm)
{
    EC_UNREFPARM(pvParm);

    m_bLogTaskRunning = EC_TRUE;
    while (!m_bShutdownLogTask)
    {
        ProcessAllMsgs();
        OsSleep(1);
    }
    ProcessAllMsgs();
    m_bLogTaskRunning = EC_FALSE;
#if (defined EC_VERSION_RTEMS)
    rtems_task_delete(RTEMS_SELF);
#endif
}